

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

void __thiscall libtorrent::create_torrent::create_torrent(create_torrent *this,torrent_info *ti)

{
  digest32<256L> *this_00;
  string_view sVar1;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> file;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> rhs;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs_00;
  strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void> piece
  ;
  file_storage *pfVar6;
  int64_t iVar7;
  string *psVar8;
  time_t tVar9;
  info_hash_t *piVar10;
  time_t tVar11;
  ulong uVar12;
  char *pcVar13;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *this_02;
  reference this_03;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *this_04;
  reference this_05;
  size_type s_00;
  value_type *pvVar14;
  difference_type dVar15;
  vector<char,std::allocator<char>> *this_06;
  char *pcVar16;
  index_type iVar17;
  span<const_char> sVar18;
  undefined1 local_1f8 [8];
  span<const_char> info;
  int local_1bc;
  strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>
  local_1b8;
  int h;
  diff_type p;
  span<const_char> pieces;
  diff_type local_17c;
  file_index_t local_178;
  int local_174;
  long local_170;
  int64_t file_size;
  uchar local_15d;
  int local_15c;
  uchar local_156;
  bitfield_flag local_155;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_154;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_150;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i_1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_144
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2_1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  __begin2_1;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2_1;
  sha1_hash local_124;
  piece_index_t local_110;
  int local_10c;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_108;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> local_fc
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __begin2
  ;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range2;
  web_seed_entry *s;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *__range1_2;
  announce_entry *t;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *__range1_1;
  reference local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *n;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range1;
  bool make_v2;
  bool make_v1;
  vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> local_30;
  torrent_info *local_18;
  torrent_info *ti_local;
  create_torrent *this_local;
  
  local_18 = ti;
  ti_local = (torrent_info *)this;
  pfVar6 = torrent_info::files(ti);
  anon_unknown_40::convert_file_storage(&local_30,pfVar6);
  libtorrent::aux::
  container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
  ::container_wrapper(&this->m_files,&local_30);
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  ~vector(&local_30);
  iVar7 = torrent_info::total_size(local_18);
  this->m_total_size = iVar7;
  iVar5 = torrent_info::piece_length(local_18);
  this->m_piece_length = iVar5;
  iVar5 = torrent_info::num_pieces(local_18);
  this->m_num_pieces = iVar5;
  psVar8 = torrent_info::name_abi_cxx11_(local_18);
  ::std::__cxx11::string::string((string *)&this->m_name,(string *)psVar8);
  entry::entry(&this->m_info_dict);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector(&this->m_urls);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_url_seeds);
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<160L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::container_wrapper(&this->m_piece_hash);
  libtorrent::aux::
  container_wrapper<libtorrent::digest32<160L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::container_wrapper(&this->m_filehashes);
  ::std::optional<libtorrent::file_storage>::optional(&this->m_file_storage_compat);
  libtorrent::aux::
  container_wrapper<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>_>
  ::container_wrapper(&this->m_file_piece_hash);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            (&this->m_similar);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_collections);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector(&this->m_nodes);
  tVar9 = time((time_t *)0x0);
  this->m_creation_date = tVar9;
  ::std::__cxx11::string::string((string *)&this->m_comment);
  ::std::__cxx11::string::string((string *)&this->m_created_by);
  ::std::__cxx11::string::string((string *)&this->m_root_cert);
  iVar5 = torrent_info::num_files(local_18);
  this->field_0x258 = this->field_0x258 & 0xfe | 1 < iVar5;
  bVar2 = torrent_info::priv(local_18);
  this->field_0x258 = this->field_0x258 & 0xfd | bVar2 * '\x02';
  this->field_0x258 = this->field_0x258 & 0xfb;
  this->field_0x258 = this->field_0x258 & 0xf7;
  piVar10 = torrent_info::info_hashes(local_18);
  bVar2 = info_hash_t::has_v1(piVar10);
  this->field_0x258 = this->field_0x258 & 0xef | (~bVar2 & 1U) << 4;
  piVar10 = torrent_info::info_hashes(local_18);
  bVar2 = info_hash_t::has_v2(piVar10);
  this->field_0x258 = this->field_0x258 & 0xdf | (~bVar2 & 1U) << 5;
  piVar10 = torrent_info::info_hashes(local_18);
  bVar2 = info_hash_t::has_v1(piVar10);
  piVar10 = torrent_info::info_hashes(local_18);
  bVar3 = info_hash_t::has_v2(piVar10);
  bVar4 = torrent_info::is_valid(local_18);
  if (bVar4) {
    tVar11 = torrent_info::creation_date(local_18);
    if (0 < tVar11) {
      tVar11 = torrent_info::creation_date(local_18);
      this->m_creation_date = tVar11;
    }
    torrent_info::creator_abi_cxx11_(local_18);
    uVar12 = ::std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      torrent_info::creator_abi_cxx11_(local_18);
      pcVar13 = (char *)::std::__cxx11::string::c_str();
      set_creator(this,pcVar13);
    }
    torrent_info::comment_abi_cxx11_(local_18);
    uVar12 = ::std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      torrent_info::comment_abi_cxx11_(local_18);
      pcVar13 = (char *)::std::__cxx11::string::c_str();
      set_comment(this,pcVar13);
    }
    this_01 = torrent_info::nodes_abi_cxx11_(local_18);
    __end1 = ::std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin(this_01);
    n = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)::std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(this_01);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                                       *)&n), bVar4) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                 ::operator*(&__end1);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)&__range1_1,local_60);
      add_node(this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     *)&__range1_1);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)&__range1_1);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::operator++(&__end1);
    }
    this_02 = torrent_info::trackers(local_18);
    __end1_1 = ::std::
               vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
               ::begin(this_02);
    t = (announce_entry *)
        ::std::
        vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ::end(this_02);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
                               *)&t), bVar4) {
      this_03 = __gnu_cxx::
                __normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
                ::operator*(&__end1_1);
      sVar1 = (string_view)
              ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_03);
      add_tracker(this,sVar1,(uint)this_03->tier);
      __gnu_cxx::
      __normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
      ::operator++(&__end1_1);
    }
    this_04 = torrent_info::web_seeds(local_18);
    __end1_2 = ::std::
               vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
               begin(this_04);
    s = (web_seed_entry *)
        ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::end
                  (this_04);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
                               *)&s), bVar4) {
      this_05 = __gnu_cxx::
                __normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
                ::operator*(&__end1_2);
      sVar1 = (string_view)
              ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_05);
      add_url_seed(this,sVar1);
      __gnu_cxx::
      __normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
      ::operator++(&__end1_2);
    }
    if (bVar2) {
      iVar5 = torrent_info::num_pieces(local_18);
      libtorrent::aux::
      container_wrapper<libtorrent::digest32<160l>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
      ::resize<int,void>((container_wrapper<libtorrent::digest32<160l>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
                          *)&this->m_piece_hash,iVar5);
      ___end2 = torrent_info::piece_range(local_18);
      local_fc = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                 ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                          *)&__end2);
      rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
            ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                   *)&__end2);
      while( true ) {
        i = local_fc.m_idx.m_val;
        local_108 = rhs.m_idx.m_val;
        bVar2 = libtorrent::operator!=(local_fc,rhs);
        if (!bVar2) break;
        local_110.m_val =
             (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  ::operator*(&local_fc);
        local_10c = local_110.m_val;
        torrent_info::hash_for_piece(&local_124,local_18,local_110);
        set_hash(this,local_110,&local_124);
        index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
        operator++(&local_fc);
      }
    }
    if (bVar3) {
      s_00 = ::std::
             vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
             size((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                   *)this);
      libtorrent::aux::
      container_wrapper<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>_>
      ::resize(&this->m_file_piece_hash,s_00);
      ___end2_1 = file_range(this);
      local_144 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                  ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                           *)&__end2_1);
      rhs_00 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
               ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                      *)&__end2_1);
      while( true ) {
        i_1 = local_144.m_idx.m_val;
        local_150 = rhs_00.m_idx.m_val;
        bVar2 = libtorrent::operator!=(local_144,rhs_00);
        if (!bVar2) break;
        local_15c = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                         ::operator*(&local_144);
        local_154 = (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)local_15c;
        pvVar14 = libtorrent::aux::
                  container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                  ::operator[](&this->m_files,
                               (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)local_15c
                              );
        local_156 = (pvVar14->flags).m_val;
        local_15d = '\x01';
        local_155 = (bitfield_flag)
                    libtorrent::flags::operator&
                              ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                               local_156,
                               (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                               '\x01');
        bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_155);
        if (!bVar2) {
          file_size._4_4_ = local_154.m_val;
          pvVar14 = libtorrent::aux::
                    container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                    ::operator[](&this->m_files,local_154);
          if (pvVar14->size != 0) {
            local_174 = local_154.m_val;
            pvVar14 = libtorrent::aux::
                      container_wrapper<libtorrent::create_file_entry,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>_>
                      ::operator[](&this->m_files,local_154);
            local_170 = pvVar14->size;
            if (this->m_piece_length < local_170) {
              h = local_154.m_val;
              sVar18 = torrent_info::piece_layer(local_18,(file_index_t)local_154.m_val);
              pieces.m_ptr = (char *)sVar18.m_len;
              _p = sVar18.m_ptr;
              memset(&local_1b8,0,4);
              for (local_1bc = 0; iVar17 = span<const_char>::size((span<const_char> *)&p),
                  file.m_val = local_154.m_val, local_1bc < (int)iVar17;
                  local_1bc = (int)dVar15 + local_1bc) {
                piece = libtorrent::aux::
                        strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>
                        ::operator++(&local_1b8,0);
                pcVar13 = span<const_char>::data((span<const_char> *)&p);
                this_00 = (digest32<256L> *)((long)&info.m_len + 4);
                digest32<256L>::digest32(this_00,pcVar13 + local_1bc);
                set_hash2(this,(file_index_t)file.m_val,(diff_type)piece.m_val,this_00);
                dVar15 = digest32<256L>::size();
              }
            }
            else {
              local_178.m_val = local_154.m_val;
              libtorrent::aux::
              strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>
              ::strong_typedef(&local_17c,0);
              pfVar6 = torrent_info::files(local_18);
              pieces.m_len._0_4_ = local_154.m_val;
              file_storage::root((sha256_hash *)((long)&pieces.m_len + 4),pfVar6,
                                 (file_index_t)local_154.m_val);
              set_hash2(this,local_178,local_17c,(sha256_hash *)((long)&pieces.m_len + 4));
            }
          }
        }
        info.m_len._0_4_ =
             index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             ::operator++(&local_144);
      }
    }
    sVar18 = torrent_info::info_section(local_18);
    info.m_ptr = (char *)sVar18.m_len;
    local_1f8 = (undefined1  [8])sVar18.m_ptr;
    this_06 = (vector<char,std::allocator<char>> *)entry::preformatted(&this->m_info_dict);
    pcVar13 = span<const_char>::data((span<const_char> *)local_1f8);
    pcVar16 = span<const_char>::data((span<const_char> *)local_1f8);
    iVar17 = span<const_char>::size((span<const_char> *)local_1f8);
    ::std::vector<char,std::allocator<char>>::assign<char_const*,void>
              (this_06,pcVar13,pcVar16 + iVar17);
  }
  return;
}

Assistant:

create_torrent::create_torrent(torrent_info const& ti)
		: m_files(convert_file_storage(ti.files()))
		, m_total_size(ti.total_size())
		, m_piece_length(ti.piece_length())
		, m_num_pieces(ti.num_pieces())
		, m_name(ti.name())
		, m_creation_date(::time(nullptr))
		, m_multifile(ti.num_files() > 1)
		, m_private(ti.priv())
		, m_include_mtime(false)
		, m_include_symlinks(false)
		, m_v2_only(!ti.info_hashes().has_v1())
		, m_v1_only(!ti.info_hashes().has_v2())
	{
		bool const make_v1 = ti.info_hashes().has_v1();
		bool const make_v2 = ti.info_hashes().has_v2();

		TORRENT_ASSERT_PRECOND(make_v2 || make_v1);
		TORRENT_ASSERT_PRECOND(ti.is_valid());
		TORRENT_ASSERT_PRECOND(ti.num_pieces() > 0);
		TORRENT_ASSERT_PRECOND(ti.num_files() > 0);
		TORRENT_ASSERT_PRECOND(ti.total_size() > 0);

		if (!ti.is_valid()) return;
		if (ti.creation_date() > 0) m_creation_date = ti.creation_date();

		if (!ti.creator().empty()) set_creator(ti.creator().c_str());
		if (!ti.comment().empty()) set_comment(ti.comment().c_str());

		for (auto const& n : ti.nodes())
			add_node(n);

		for (auto const& t : ti.trackers())
			add_tracker(t.url, t.tier);

		for (auto const& s : ti.web_seeds())
			add_url_seed(s.url);

		if (make_v1)
		{
			m_piece_hash.resize(ti.num_pieces());
			for (auto const i : ti.piece_range())
				set_hash(i, ti.hash_for_piece(i));
		}

		if (make_v2)
		{
			m_file_piece_hash.resize(m_files.size());
			for (auto const i : file_range())
			{
				// don't include merkle hash trees for pad files
				if (m_files[i].flags & file_storage::flag_pad_file) continue;
				if (m_files[i].size == 0) continue;

				auto const file_size = m_files[i].size;
				if (file_size <= m_piece_length)
				{
					set_hash2(i, piece_index_t::diff_type{0}, ti.files().root(i));
					continue;
				}

				span<char const> pieces = ti.piece_layer(i);

				piece_index_t::diff_type p{0};
				for (int h = 0; h < int(pieces.size()); h += int(sha256_hash::size()))
					set_hash2(i, p++, sha256_hash(pieces.data() + h));
			}
		}

		auto const info = ti.info_section();
		m_info_dict.preformatted().assign(info.data(), info.data() + info.size());
	}